

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::
MapTest_ErasingEnoughCausesDownwardRehashOnNextInsert_Test::
~MapTest_ErasingEnoughCausesDownwardRehashOnNextInsert_Test
          (MapTest_ErasingEnoughCausesDownwardRehashOnNextInsert_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MapTest, ErasingEnoughCausesDownwardRehashOnNextInsert) {
  for (size_t capacity = 1; capacity < 1000; capacity *= 2) {
    const size_t max_size = MapTestPeer::CalculateHiCutoff(capacity);
    for (size_t min_size = 1; min_size < max_size / 4; ++min_size) {
      Map<int, int> m;
      while (m.size() < max_size) m[m.size()];
      const size_t num_buckets = MapTestPeer::NumBuckets(m);
      while (m.size() > min_size) m.erase(m.size() - 1);
      // Erasing doesn't shrink the table.
      ASSERT_EQ(num_buckets, MapTestPeer::NumBuckets(m));
      // This insertion causes a shrinking rehash because the load factor is too
      // low.
      m[99999];
      size_t new_num_buckets = MapTestPeer::NumBuckets(m);
      EXPECT_LT(new_num_buckets, num_buckets);
      EXPECT_LE(m.size(),
                MapTestPeer::CalculateHiCutoff(MapTestPeer::NumBuckets(m)));
    }
  }
}